

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

token * get_next_token(token *__return_storage_ptr__,iit *iter,iit *end)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  token *e;
  token retval;
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68._0_4_ = tokNil;
  local_50._M_dataplus._M_p = local_68 + 0x28;
  local_68._8_8_ = (char *)0x0;
  local_68._16_8_ = (char *)0x0;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar3 = skip_space(iter,end);
  if (!bVar3) {
    pcVar5 = end->_M_current;
    __return_storage_ptr__->toktype = tokEOF;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    (__return_storage_ptr__->lexeme)._M_string_length = 0;
    (__return_storage_ptr__->lexeme).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->start_iter)._M_current = pcVar5;
    (__return_storage_ptr__->end_iter)._M_current = pcVar5;
    goto LAB_0010168c;
  }
  local_68._8_8_ = iter->_M_current;
  std::__cxx11::string::assign((char *)(local_68 + 0x18));
  pcVar5 = iter->_M_current;
  cVar1 = *pcVar5;
  if (cVar1 == '(') {
    local_68._0_4_ = tokOpenParen;
LAB_00101667:
    std::__cxx11::string::operator=((string *)(local_68 + 0x18),*pcVar5);
    local_68._16_8_ = iter->_M_current + 1;
    iter->_M_current = (char *)local_68._16_8_;
  }
  else {
    if (cVar1 == ')') {
      local_68._0_4_ = tokCloseParen;
      goto LAB_00101667;
    }
    if (cVar1 == ';') {
      local_68._0_4_ = tokSemi;
      goto LAB_00101667;
    }
    if (local_68._0_4_ != tokNil) goto LAB_00101667;
    while (pcVar2 = end->_M_current, pcVar5 != pcVar2) {
      cVar1 = *pcVar5;
      iVar4 = isalnum((int)cVar1);
      if ((iVar4 == 0) && (cVar1 != '_')) break;
      std::__cxx11::string::push_back((char)local_68 + '\x18');
      pcVar5 = iter->_M_current + 1;
      iter->_M_current = pcVar5;
    }
    if (pcVar5 == (char *)local_68._8_8_) {
      __return_storage_ptr__->toktype = tokEOF;
      (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->lexeme).field_2;
      (__return_storage_ptr__->lexeme)._M_string_length = 0;
      (__return_storage_ptr__->lexeme).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->start_iter)._M_current = pcVar2;
      (__return_storage_ptr__->end_iter)._M_current = pcVar2;
      goto LAB_0010168c;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_68 + 0x18),"var");
    if (bVar3) {
      local_68._0_4_ = tokVar;
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_68 + 0x18),"func");
      if (bVar3) {
        local_68._0_4_ = tokFunc;
      }
      else {
        local_68._0_4_ = tokIdent;
      }
    }
    local_68._16_8_ = iter->_M_current;
  }
  token::token(__return_storage_ptr__,(token *)local_68);
LAB_0010168c:
  std::__cxx11::string::~string((string *)(local_68 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

token get_next_token(iit &iter, iit &end) {
    token retval;
    
    if (! skip_space(iter, end)) {
        return token::mkend(end);
    }
    
    // skip_space guarantees we are not at the end of 
    // input but are at a non-space character.
    
    retval.start_iter = iter;
    retval.lexeme = "";
    
    // check punctuation first
    switch (*iter) {
        case ';' : retval.toktype = tokSemi; break;
        case '(' : retval.toktype = tokOpenParen; break;
        case ')' : retval.toktype = tokCloseParen; break;
    };
    
    if (retval.toktype != tokNil) {
        retval.lexeme = *iter;
        retval.end_iter = ++iter;
        return retval;
    }
    
    while (iter != end) {
        if (std::isalnum(*iter))
            retval.lexeme += *iter;
        else if (*iter == '_')
            retval.lexeme += '_';
        else
            break;
        
        ++iter;
    }
    
    if (iter == retval.start_iter) {
        // we didn't consume any input. (Except maybe spaces).
        // So just signal the end. Otherwise any outer loop
        // will spin forever.
        return token::mkend(end);
    }
    
    if (retval.lexeme == "var" )
        retval.toktype = tokVar;
    else if (retval.lexeme == "func" )
        retval.toktype = tokFunc;
    else
        retval.toktype = tokIdent;
        
    retval.end_iter = iter;

    
    return retval;
}